

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O2

sexp_conflict
sexp_bit_and(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x,sexp_conflict y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  sexp_conflict psVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  sexp_conflict local_70;
  sexp_conflict x2;
  sexp_conflict y2;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_70 = (sexp_conflict)0x43e;
  x2 = (sexp_conflict)0x43e;
  y2 = (sexp_conflict)0x43e;
  if (((ulong)x & 1) != 0) {
    if (((ulong)y & 1) != 0) {
      return (sexp_conflict)((ulong)y & (ulong)x);
    }
    if ((((ulong)y & 2) == 0) && (y->tag == 0xc)) {
      psVar5 = sexp_bit_and(ctx,self,n,y,x);
      return psVar5;
    }
  }
  if ((((ulong)x & 3) != 0) || (x->tag != 0xc)) {
    psVar5 = (sexp_conflict)sexp_type_exception(ctx,self,2,x);
    return psVar5;
  }
  local_58.var = &local_70;
  local_38.next = &local_58;
  local_58.next = (ctx->value).context.saves;
  local_38.var = &x2;
  local_48.next = &local_38;
  local_48.var = &y2;
  (ctx->value).context.saves = &local_48;
  x2 = sexp_twos_complement(ctx,x);
  y2 = sexp_twos_complement(ctx,y);
  if ((long)y2 < 0 && ((ulong)y2 & 1) != 0) {
    y2 = sexp_fixnum_to_twos_complement(ctx,y2,(x2->value).promise.donep);
  }
  if (((ulong)y2 & 1) == 0) {
    if ((((ulong)y2 & 2) == 0) && (y2->tag == 0xc)) {
      lVar1 = (x2->value).fileno.fd;
      lVar2 = (y2->value).fileno.fd;
      psVar5 = y2;
      if (lVar2 < lVar1) {
        psVar5 = x2;
      }
      lVar9 = 0;
      local_70 = (sexp_conflict)sexp_copy_bignum(ctx,0,psVar5,0);
      lVar3 = (local_70->value).fileno.fd;
      lVar6 = 0;
      if (0 < lVar3) {
        lVar6 = lVar3;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        if (lVar9 < lVar1) {
          uVar7 = *(ulong *)((long)&x2->value + lVar9 * 8 + 0x10);
        }
        else {
          uVar7 = (ulong)((x2->value).flonum_bits[0] >> 7);
        }
        if (lVar9 < lVar2) {
          uVar8 = *(ulong *)((long)&y2->value + lVar9 * 8 + 0x10);
        }
        else {
          uVar8 = (ulong)((y2->value).flonum_bits[0] >> 7);
        }
        *(ulong *)((long)&local_70->value + lVar9 * 8 + 0x10) = uVar8 & uVar7;
      }
      if ((((x2->value).flonum_bits[0] < '\0') || ((y2->value).flonum_bits[0] < '\0')) &&
         (*(long *)((long)&local_70->value + lVar3 * 8 + 8) < 0)) {
        sexp_set_twos_complement(local_70);
        cVar4 = (local_70->value).flonum_bits[0];
        if (cVar4 < '\x01') goto LAB_001013ce;
      }
      else {
        cVar4 = (local_70->value).flonum_bits[0];
        if (-1 < cVar4) goto LAB_001013ce;
      }
      if ((((ulong)local_70 & 3) == 0) && (local_70->tag == 0xc)) {
        (local_70->value).flonum_bits[0] = -cVar4;
      }
      else if (((ulong)local_70 & 1) != 0) {
        local_70 = (sexp_conflict)(1 - ((ulong)local_70 & 0xfffffffffffffffe));
      }
    }
    else {
      local_70 = (sexp_conflict)sexp_type_exception(ctx,self,2,y2);
    }
  }
  else {
    local_70 = (sexp_conflict)(((x2->value).uvector.length * 2 & (ulong)y2) + 1);
  }
LAB_001013ce:
  (ctx->value).context.saves = local_58.next;
  psVar5 = (sexp_conflict)sexp_bignum_normalize(local_70);
  return psVar5;
}

Assistant:

sexp sexp_bit_and (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp y) {
#if SEXP_USE_BIGNUMS
  sexp_sint_t len, lenx, leny, i;
#endif
  sexp_gc_var3(res, x2, y2);
  if (sexp_fixnump(x) && sexp_fixnump(y)) {
    return (sexp) ((sexp_uint_t)x & (sexp_uint_t)y);  /* safe to AND tags */
#if SEXP_USE_BIGNUMS
  } else if (sexp_fixnump(x) && sexp_bignump(y)) {
    return sexp_bit_and(ctx, self, n, y, x);
  } else if (sexp_bignump(x)) {
    sexp_gc_preserve3(ctx, res, x2, y2);
    x2 = sexp_twos_complement(ctx, x);
    y2 = sexp_twos_complement(ctx, y);
    if (sexp_fixnump(y2) && sexp_unbox_fixnum(y2) < 0)
      y2 = sexp_fixnum_to_twos_complement(ctx, y2, sexp_bignum_length(x2));
    if (sexp_fixnump(y2)) {
      res = sexp_make_fixnum(sexp_unbox_fixnum(y2) & sexp_bignum_data(x2)[0]);
    } else if (sexp_bignump(y2)) {
      lenx = sexp_bignum_length(x2);
      leny = sexp_bignum_length(y2);
      if (leny < lenx)
        res = sexp_copy_bignum(ctx, NULL, x2, 0);
      else
        res = sexp_copy_bignum(ctx, NULL, y2, 0);
      for (i=0, len=sexp_bignum_length(res); i<len; i++)
        sexp_bignum_data(res)[i]
          = (i<lenx ? sexp_bignum_data(x2)[i] : sexp_bignum_sign(x2) < 0 ? -1 : 0) &
            (i<leny ? sexp_bignum_data(y2)[i] : sexp_bignum_sign(y2) < 0 ? -1 : 0);
      if ((sexp_bignum_sign(x2) < 0 || sexp_bignum_sign(y2) < 0) && ((sexp_sint_t)(sexp_bignum_data(res)[len-1])) < 0) {
        sexp_set_twos_complement(res);
        if (sexp_bignum_sign(res) > 0) {
          sexp_negate_exact(res);
        }
      } else if (sexp_bignum_sign(res) < 0) {
        sexp_negate_exact(res);
      }
    } else {
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y2);
    }
    sexp_gc_release3(ctx);
    return sexp_bignum_normalize(res);
#endif
  } else {
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
}